

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

try_update_result_type __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::try_remove
          (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k)

{
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
  *this_00;
  long *plVar1;
  uintptr_t uVar2;
  long lVar3;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar4;
  undefined1 auVar5 [8];
  version_type this_01;
  bool bVar6;
  byte bVar7;
  optional<bool> oVar8;
  uint uVar9;
  undefined6 extraout_var;
  ushort uVar10;
  node_type type;
  ushort uVar11;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
  *this_02;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_c8;
  art_key_type k_local;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
  *child_in_parent;
  olc_node_ptr child;
  read_critical_section *local_a8;
  node_type *local_a0;
  basic_node_ptr<unodb::detail::olc_node_header> *local_98;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *local_90;
  undefined1 auStack_88 [8];
  leaf_reclaimable_ptr r;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_70;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
  *node_in_parent;
  read_critical_section parent_critical_section;
  _Head_base<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
  _Stack_50;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_48;
  art_key_type remaining_key;
  node_type local_36;
  byte local_35;
  undefined4 local_34;
  node_type child_type;
  
  local_c8 = k.field_0;
  optimistic_lock::try_read_lock((optimistic_lock *)&node_in_parent);
  if (node_in_parent !=
      (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)0x0) {
    piVar4 = (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
             (this->root).value._M_i.tagged_ptr;
    bVar6 = optimistic_lock::read_critical_section::check((read_critical_section *)&node_in_parent);
    if (bVar6) {
      if (piVar4 == (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     *)0x0) {
        uVar11 = 0x100;
        uVar10 = 0;
        goto LAB_001147ec;
      }
      r._M_t.
      super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
      ._M_head_impl = (basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)this;
      optimistic_lock::try_read_lock((optimistic_lock *)&parent_critical_section.version);
      this_01 = parent_critical_section.version;
      if (parent_critical_section.version.version == 0) {
LAB_00114821:
        uVar10 = 0;
        bVar7 = 0;
      }
      else {
        type = (node_type)piVar4 & (I256|I48);
        local_90 = piVar4;
        if (((ulong)piVar4 & 7) == 0) {
          bVar6 = detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::matches
                            ((basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
                             ((ulong)piVar4 & 0xfffffffffffffff8),(art_key_type)k.field_0);
          if (bVar6) {
            local_70 = (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
                       optimistic_lock::write_guard::try_lock_upgrade
                                 ((read_critical_section *)&node_in_parent);
            if ((optimistic_lock *)local_70.key == (optimistic_lock *)0x0) {
              bVar7 = false;
            }
            else {
              local_48 = (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
                         optimistic_lock::write_guard::try_lock_upgrade
                                   ((read_critical_section *)&parent_critical_section.version);
              bVar6 = (optimistic_lock *)local_48.key == (optimistic_lock *)0x0;
              if (bVar6) {
                local_48.key = 0;
              }
              else {
                optimistic_lock::write_unlock_and_obsolete((optimistic_lock *)local_48);
                local_48.key = 0;
                auStack_88 = (undefined1  [8])
                             r._M_t.
                             super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             .
                             super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
                             ._M_head_impl;
                (r._M_t.
                 super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 .
                 super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
                ._M_head_impl)->key_size = 0;
                (r._M_t.
                 super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 .
                 super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
                ._M_head_impl)->value_size = 0;
                r._M_t.
                super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                .
                super__Tuple_impl<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                .
                super__Head_base<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                ._M_head_impl.db_instance =
                     (_Head_base<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                      )(_Head_base<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                        )((ulong)piVar4 & 0xfffffffffffffff8);
                std::
                unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               *)auStack_88);
              }
              bVar7 = !bVar6;
              optimistic_lock::write_guard::~write_guard((write_guard *)&local_48.key_bytes);
            }
            optimistic_lock::write_guard::~write_guard((write_guard *)&local_70.key_bytes);
            uVar10 = 1;
          }
          else {
            if (*(long *)(this_01.version + 8) < 1) {
LAB_001148af:
              __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                            ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
            }
            if (_Stack_50._M_head_impl.db_instance !=
                (db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 )*(olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> **)
                   this_01.version) {
              optimistic_lock::dec_read_lock_count((optimistic_lock *)this_01.version);
              parent_critical_section.version.version = 0;
              goto LAB_00114821;
            }
            LOCK();
            plVar1 = (long *)(this_01.version + 8);
            lVar3 = *plVar1;
            *plVar1 = *plVar1 + -1;
            UNLOCK();
            if (SBORROW8(lVar3,1) != *plVar1 < 0) {
LAB_001148ce:
              __assert_fail("old_value > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                            ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
            }
            parent_critical_section.version.version = 0;
            bVar7 = 1;
            uVar10 = 0;
          }
        }
        else {
          local_70.key = (unsigned_long)
                         &(r._M_t.
                           super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                           .
                           super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
                          ._M_head_impl)->key_size;
          remaining_key.field_0.key._4_4_ = SUB84(&local_48,0);
          local_48 = k.field_0;
          local_34 = remaining_key.field_0.key._4_4_;
          do {
            if (type == LEAF) {
              __assert_fail("node_type != node_type::LEAF",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                            ,0x7d6,
                            "typename olc_db<Key, Value>::try_update_result_type unodb::olc_db<unsigned long, std::span<const std::byte>>::try_remove(art_key_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                           );
            }
            this_02 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
                       *)((ulong)local_90 & 0xfffffffffffffff8);
            this_00 = (key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                       *)(this_02 + 0x18);
            bVar7 = detail::
                    key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                    ::length(this_00);
            uVar9 = detail::
                    key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                    ::get_shared_length(this_00,local_48.key);
            if (uVar9 < bVar7) {
              if ((long)node_in_parent[1].value._M_i.tagged_ptr < 1) goto LAB_001148af;
              if (parent_critical_section.lock ==
                  (optimistic_lock *)(node_in_parent->value)._M_i.tagged_ptr) {
                LOCK();
                piVar4 = node_in_parent + 1;
                uVar2 = (piVar4->value)._M_i.tagged_ptr;
                (piVar4->value)._M_i.tagged_ptr = (piVar4->value)._M_i.tagged_ptr - 1;
                UNLOCK();
                if (SBORROW8(uVar2,1) != (long)(piVar4->value)._M_i.tagged_ptr < 0)
                goto LAB_001148ce;
                node_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)0x0;
                if (*(long *)(parent_critical_section.version.version + 8) < 1) goto LAB_001148af;
                if (_Stack_50._M_head_impl.db_instance ==
                    (db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     )*(olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                        **)parent_critical_section.version.version) {
                  LOCK();
                  plVar1 = (long *)(parent_critical_section.version.version + 8);
                  lVar3 = *plVar1;
                  *plVar1 = *plVar1 + -1;
                  UNLOCK();
                  if (SBORROW8(lVar3,1) != *plVar1 < 0) goto LAB_001148ce;
                  parent_critical_section.version.version = 0;
                  local_34 = (undefined4)CONCAT71(_Stack_50._M_head_impl.db_instance._1_7_,1);
                  remaining_key.field_0.key._4_4_ = 0;
                  break;
                }
                optimistic_lock::dec_read_lock_count
                          ((optimistic_lock *)parent_critical_section.version.version);
                parent_critical_section.version.version = 0;
              }
              else {
                optimistic_lock::dec_read_lock_count((optimistic_lock *)node_in_parent);
                node_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)0x0;
              }
              local_34 = 0;
              break;
            }
            if (uVar9 != bVar7) {
              __assert_fail("shared_prefix_length == key_prefix_length",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                            ,0x7e7,
                            "typename olc_db<Key, Value>::try_update_result_type unodb::olc_db<unsigned long, std::span<const std::byte>>::try_remove(art_key_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                           );
            }
            detail::basic_art_key<unsigned_long>::shift_right
                      ((basic_art_key<unsigned_long> *)&local_48.key_bytes,(ulong)bVar7);
            auStack_88 = (undefined1  [8])0x0;
            r._M_t.
            super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            .
            super__Tuple_impl<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            .
            super__Head_base<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
            ._M_head_impl.db_instance =
                 (_Head_base<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                  )(db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                    )0x0;
            local_35 = local_48.key_bytes._M_elems[0];
            child.tagged_ptr = (uintptr_t)&k_local;
            local_a0 = &local_36;
            local_98 = (basic_node_ptr<unodb::detail::olc_node_header> *)&child_in_parent;
            local_a8 = (read_critical_section *)auStack_88;
            oVar8 = detail::
                    basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
                    ::
                    remove_or_choose_subtree<std::optional<bool>,std::byte,unodb::detail::basic_art_key<unsigned_long>&,unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::optimistic_lock::read_critical_section&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>**,unodb::optimistic_lock::read_critical_section*,unodb::node_type*,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>*>
                              (this_02,type,&local_35,
                               (basic_art_key<unsigned_long> *)&local_c8.key_bytes,
                               (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                                *)r._M_t.
                                  super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                  .
                                  super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
                                  ._M_head_impl,(read_critical_section *)&node_in_parent,
                               (read_critical_section *)&parent_critical_section.version,
                               (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                                **)&local_70,
                               (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                                ***)&child,&local_a8,&local_a0,&local_98);
            auVar5 = auStack_88;
            if (((uint)CONCAT62(extraout_var,
                                oVar8.super__Optional_base<bool,_true,_true>._M_payload.
                                super__Optional_payload_base<bool>) >> 8 & 1) == 0) {
              local_34 = 0;
LAB_0011467c:
              bVar6 = false;
            }
            else {
              if (((ushort)oVar8.super__Optional_base<bool,_true,_true>._M_payload.
                           super__Optional_payload_base<bool> & 1) == 0) {
                local_34 = (undefined4)
                           CONCAT71((int7)(CONCAT62(extraout_var,
                                                    oVar8.super__Optional_base<bool,_true,_true>.
                                                    _M_payload.super__Optional_payload_base<bool>)
                                          >> 8),1);
                remaining_key.field_0.key._4_4_ = 0;
                goto LAB_0011467c;
              }
              if (k_local.field_0 == 0) {
                remaining_key.field_0.key._4_4_ = 1;
                bVar6 = false;
                local_34 = 1;
              }
              else {
                node_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)parent_critical_section.version.version;
                parent_critical_section.lock = (optimistic_lock *)_Stack_50._M_head_impl.db_instance
                ;
                local_90 = child_in_parent;
                auStack_88 = (undefined1  [8])0x0;
                local_48.key = local_48.key >> 8;
                local_70 = k_local.field_0;
                parent_critical_section.version.version = (version_tag_type)auVar5;
                _Stack_50._M_head_impl.db_instance =
                     (db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      )(db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                        )r._M_t.
                         super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         .
                         super__Tuple_impl<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         .
                         super__Head_base<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                         ._M_head_impl.db_instance;
                bVar6 = true;
                type = local_36;
              }
            }
            optimistic_lock::read_critical_section::~read_critical_section
                      ((read_critical_section *)auStack_88);
          } while (bVar6);
          uVar10 = (ushort)remaining_key.field_0.key._4_4_ & 0xff;
          bVar7 = (byte)local_34;
        }
      }
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)&parent_critical_section.version);
      uVar11 = (ushort)bVar7 << 8;
      goto LAB_001147ec;
    }
  }
  uVar10 = 0;
  uVar11 = 0;
LAB_001147ec:
  optimistic_lock::read_critical_section::~read_critical_section
            ((read_critical_section *)&node_in_parent);
  return (_Optional_base<bool,_true,_true>)(uVar10 | uVar11);
}

Assistant:

typename olc_db<Key, Value>::try_update_result_type
olc_db<Key, Value>::try_remove(art_key_type k) {
  auto parent_critical_section = root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  auto node{root.load()};

  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) return false;

  auto node_critical_section = node_ptr_lock(node).try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  auto node_type = node.type();

  if (node_type == node_type::LEAF) {
    auto* const leaf{node.template ptr<leaf_type*>()};
    if (leaf->matches(k)) {
      const optimistic_lock::write_guard parent_guard{
          std::move(parent_critical_section)};
      // Do not call spin_wait_loop_body from this point on - assume
      // the above took enough time
      if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

      optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
      if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

      node_guard.unlock_and_obsolete();

      const auto r{art_policy::reclaim_leaf_on_scope_exit(leaf, *this)};
      root = detail::olc_node_ptr{nullptr};
      return true;
    }

    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  auto* node_in_parent{&root};
  tree_depth_type depth{};
  auto remaining_key{k};

  while (true) {
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node.template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_prefix_length{
        key_prefix.get_shared_length(remaining_key)};

    if (shared_prefix_length < key_prefix_length) {
      if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE

      return false;
    }

    UNODB_DETAIL_ASSERT(shared_prefix_length == key_prefix_length);
    depth += key_prefix_length;
    remaining_key.shift_right(key_prefix_length);

    UNODB_DETAIL_DISABLE_MSVC_WARNING(26494)
    in_critical_section<detail::olc_node_ptr>* child_in_parent;
    enum node_type child_type;
    detail::olc_node_ptr child;
    UNODB_DETAIL_RESTORE_MSVC_WARNINGS()

    optimistic_lock::read_critical_section child_critical_section;

    const auto opt_remove_result{
        inode->template remove_or_choose_subtree<std::optional<bool>>(
            node_type, remaining_key[0], k, *this, parent_critical_section,
            node_critical_section, node_in_parent, &child_in_parent,
            &child_critical_section, &child_type, &child)};

    if (UNODB_DETAIL_UNLIKELY(!opt_remove_result)) return {};

    if (const auto remove_result{*opt_remove_result}; !remove_result)
      return false;

    if (child_in_parent == nullptr) return true;

    parent_critical_section = std::move(node_critical_section);
    node = child;
    node_in_parent = child_in_parent;
    node_critical_section = std::move(child_critical_section);
    node_type = child_type;

    ++depth;
    remaining_key.shift_right(1);
  }
}